

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<CTestResource_Test1DLinearResource_Test>::CreateTest
          (TestFactoryImpl<CTestResource_Test1DLinearResource_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x10);
  if (this_00 != (Test *)0x0) {
    Test::Test(this_00);
    this_00->_vptr_Test = (_func_int **)&PTR__CTestResource_001d46d0;
  }
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }